

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n2builder.cpp
# Opt level: O3

void __thiscall
icu_63::Normalizer2DataBuilder::setHangulData
          (Normalizer2DataBuilder *this,UMutableCPTrie *norm16Trie)

{
  UErrorCode *pErrorCode;
  int iVar1;
  uint32_t uVar2;
  undefined8 extraout_RAX;
  uint uVar3;
  long lVar4;
  IcuToolErrorCode errorCode;
  IcuToolErrorCode local_48;
  
  lVar4 = 0;
  do {
    uVar3 = (&HangulIterator::ranges)[lVar4 * 2];
    iVar1 = (&DAT_002f4864)[lVar4 * 2];
    if ((int)uVar3 <= iVar1) {
      do {
        uVar2 = umutablecptrie_get_63(norm16Trie,uVar3);
        if (1 < uVar2) {
          setHangulData((Normalizer2DataBuilder *)(ulong)uVar3);
          IcuToolErrorCode::~IcuToolErrorCode(&local_48);
          _Unwind_Resume(extraout_RAX);
        }
        uVar3 = uVar3 + 1;
      } while (iVar1 + 1U != uVar3);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  pErrorCode = &local_48.super_ErrorCode.errorCode;
  local_48.super_ErrorCode.errorCode = U_ZERO_ERROR;
  local_48.super_ErrorCode._vptr_ErrorCode = (_func_int **)&PTR__IcuToolErrorCode_003abfa8;
  local_48.location = "gennorm2/setHangulData()";
  if (0x1161 < this->indexes[9]) {
    this->indexes[9] = 0x1161;
  }
  umutablecptrie_setRange_63(norm16Trie,0x1100,0x1112,2,pErrorCode);
  umutablecptrie_setRange_63(norm16Trie,0x1161,0x1175,0xfe00,pErrorCode);
  umutablecptrie_setRange_63(norm16Trie,0x11a8,0x11c2,0xfe00,pErrorCode);
  uVar2 = this->indexes[10];
  if (0xac00 < this->indexes[8]) {
    this->indexes[8] = 0xac00;
  }
  uVar3 = this->indexes[0xe];
  umutablecptrie_set_63(norm16Trie,0xac00,uVar2,pErrorCode);
  umutablecptrie_setRange_63(norm16Trie,0xac01,0xd7a3,uVar3 | 1,pErrorCode);
  uVar3 = 0xac00;
  while (uVar3 < 0xd788) {
    uVar3 = uVar3 + 0x1c;
    umutablecptrie_set_63(norm16Trie,uVar3,uVar2,pErrorCode);
  }
  ErrorCode::assertSuccess(&local_48.super_ErrorCode);
  IcuToolErrorCode::~IcuToolErrorCode(&local_48);
  return;
}

Assistant:

void Normalizer2DataBuilder::setHangulData(UMutableCPTrie *norm16Trie) {
    HangulIterator hi;
    const HangulIterator::Range *range;
    // Check that none of the Hangul/Jamo code points have data.
    while((range=hi.nextRange())!=NULL) {
        for(UChar32 c=range->start; c<=range->end; ++c) {
            if(umutablecptrie_get(norm16Trie, c)>Normalizer2Impl::INERT) {
                fprintf(stderr,
                        "gennorm2 error: "
                        "illegal mapping/composition/ccc data for Hangul or Jamo U+%04lX\n",
                        (long)c);
                exit(U_INVALID_FORMAT_ERROR);
            }
        }
    }
    // Set data for algorithmic runtime handling.
    IcuToolErrorCode errorCode("gennorm2/setHangulData()");

    // Jamo V/T are maybeYes
    if(Hangul::JAMO_V_BASE<indexes[Normalizer2Impl::IX_MIN_COMP_NO_MAYBE_CP]) {
        indexes[Normalizer2Impl::IX_MIN_COMP_NO_MAYBE_CP]=Hangul::JAMO_V_BASE;
    }
    umutablecptrie_setRange(norm16Trie, Hangul::JAMO_L_BASE, Hangul::JAMO_L_END,
                            Normalizer2Impl::JAMO_L, errorCode);
    umutablecptrie_setRange(norm16Trie, Hangul::JAMO_V_BASE, Hangul::JAMO_V_END,
                            Normalizer2Impl::JAMO_VT, errorCode);
    // JAMO_T_BASE+1: not U+11A7
    umutablecptrie_setRange(norm16Trie, Hangul::JAMO_T_BASE+1, Hangul::JAMO_T_END,
                            Normalizer2Impl::JAMO_VT, errorCode);

    // Hangul LV encoded as minYesNo
    uint32_t lv=indexes[Normalizer2Impl::IX_MIN_YES_NO];
    // Hangul LVT encoded as minYesNoMappingsOnly|HAS_COMP_BOUNDARY_AFTER
    uint32_t lvt=indexes[Normalizer2Impl::IX_MIN_YES_NO_MAPPINGS_ONLY]|
        Normalizer2Impl::HAS_COMP_BOUNDARY_AFTER;
    if(Hangul::HANGUL_BASE<indexes[Normalizer2Impl::IX_MIN_DECOMP_NO_CP]) {
        indexes[Normalizer2Impl::IX_MIN_DECOMP_NO_CP]=Hangul::HANGUL_BASE;
    }
    // Set the first LV, then write all other Hangul syllables as LVT,
    // then overwrite the remaining LV.
    umutablecptrie_set(norm16Trie, Hangul::HANGUL_BASE, lv, errorCode);
    umutablecptrie_setRange(norm16Trie, Hangul::HANGUL_BASE+1, Hangul::HANGUL_END, lvt, errorCode);
    UChar32 c=Hangul::HANGUL_BASE;
    while((c+=Hangul::JAMO_T_COUNT)<=Hangul::HANGUL_END) {
        umutablecptrie_set(norm16Trie, c, lv, errorCode);
    }
    errorCode.assertSuccess();
}